

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::spans_v
          (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
          Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this)

{
  pointer pIVar1;
  int iVar2;
  undefined4 extraout_var;
  Index IVar3;
  undefined4 extraout_var_00;
  Index IVar4;
  Scalar *pSVar5;
  long lVar6;
  long lVar7;
  element_type *in_XMM1_Qa;
  __shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2> local_88;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *local_78;
  __shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  local_70;
  long local_60;
  Scalar local_58;
  Scalar local_50;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots;
  
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::data((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_88);
  NurbsSurfaceGeometry<2L>::knots_v(&knots,local_88._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[5])(this);
  IVar3 = Nurbs::upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var,iVar2),&knots,(double *)&local_88);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[5])(this);
  local_88._M_ptr = in_XMM1_Qa;
  IVar4 = Nurbs::lower_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var_00,iVar2),&knots,(double *)&local_88);
  local_60 = IVar4 - IVar3;
  local_78 = __return_storage_ptr__;
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,local_60 + 1,(allocator_type *)&local_88);
  lVar6 = 8;
  for (lVar7 = 0; lVar7 <= local_60; lVar7 = lVar7 + 1) {
    std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_70,
                   (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&this->m_surface_geometry);
    std::__shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               &((local_70._M_ptr)->m_data).
                super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &(local_88._M_ptr)->m_knots_v,IVar3 + lVar7);
    local_50 = *pSVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_70,
                   (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&this->m_surface_geometry);
    std::__shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               &((local_70._M_ptr)->m_data).
                super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &(local_88._M_ptr)->m_knots_v,IVar3 + lVar7 + 1);
    local_58 = *pSVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    pIVar1 = (local_78->super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(Scalar *)((long)pIVar1 + lVar6 + -8) = local_50;
    *(Scalar *)((long)&pIVar1->m_t0 + lVar6) = local_58;
    lVar6 = lVar6 + 0x10;
  }
  return local_78;
}

Assistant:

std::vector<Interval> spans_v() const override
    {
        auto knots = m_surface_geometry->knots_v();

        Index first_span = Nurbs::upper_span(degree_v(), knots, domain_v().t0());
        Index last_span = Nurbs::lower_span(degree_v(), knots, domain_v().t1());

        Index nb_spans = last_span - first_span + 1;

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double v0 = surface_geometry()->knot_v(first_span + i);
            double v1 = surface_geometry()->knot_v(first_span + i + 1);

            result[i] = Interval(v0, v1);
        }

        return result;
    }